

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

ssize_t ossl_send(Curl_easy *data,int sockindex,void *mem,size_t len,CURLcode *curlcode)

{
  connectdata *pcVar1;
  ssl_backend_data *psVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint *puVar6;
  size_t sVar7;
  size_t size;
  size_t size_00;
  char *pcVar8;
  char error_buffer [256];
  char local_138 [255];
  undefined1 local_39;
  
  pcVar1 = data->conn;
  psVar2 = pcVar1->ssl[sockindex].backend;
  ERR_clear_error();
  sVar7 = 0x7fffffff;
  if (len < 0x7fffffff) {
    sVar7 = len;
  }
  (pcVar1->ssl[0].backend)->logger = data;
  uVar3 = SSL_write((SSL *)psVar2->handle,mem,(int)sVar7);
  if (0 < (int)uVar3) {
    *curlcode = CURLE_OK;
    return (ulong)uVar3;
  }
  iVar4 = SSL_get_error((SSL *)psVar2->handle,uVar3);
  switch(iVar4) {
  case 0:
    pcVar8 = "SSL_ERROR_NONE";
    break;
  case 1:
    uVar5 = ERR_get_error();
    if ((((int)uVar5 == 0xa000080) && (pcVar1->ssl[sockindex].state == ssl_connection_complete)) &&
       (pcVar1->proxy_ssl[sockindex].state == ssl_connection_complete)) {
      ossl_version(local_138,0x78);
      pcVar8 = "Error: %s does not support double SSL tunneling.";
    }
    else {
      ossl_strerror(uVar5,local_138,size);
      pcVar8 = "SSL_write() error: %s";
    }
    Curl_failf(data,pcVar8,local_138);
    goto LAB_0052625a;
  case 2:
  case 3:
    *curlcode = CURLE_AGAIN;
    return -1;
  case 4:
    pcVar8 = "SSL_ERROR_WANT_X509_LOOKUP";
    break;
  case 5:
    puVar6 = (uint *)__errno_location();
    uVar3 = *puVar6;
    uVar5 = ERR_get_error();
    if (uVar5 == 0) {
      if (uVar3 == 0) {
        strncpy(local_138,"SSL_ERROR_SYSCALL",0x100);
        local_39 = 0;
      }
      else {
        Curl_strerror(uVar3,local_138,0x100);
      }
    }
    else {
      ossl_strerror(uVar5,local_138,size_00);
    }
    pcVar8 = local_138;
    goto LAB_00526253;
  case 6:
    pcVar8 = "SSL_ERROR_ZERO_RETURN";
    break;
  case 7:
    pcVar8 = "SSL_ERROR_WANT_CONNECT";
    break;
  case 8:
    pcVar8 = "SSL_ERROR_WANT_ACCEPT";
    break;
  case 9:
    pcVar8 = "SSL_ERROR_WANT_ASYNC";
    break;
  case 10:
    pcVar8 = "SSL_ERROR_WANT_ASYNC_JOB";
    break;
  default:
    pcVar8 = "SSL_ERROR unknown";
  }
  puVar6 = (uint *)__errno_location();
  uVar3 = *puVar6;
LAB_00526253:
  Curl_failf(data,"OpenSSL SSL_write: %s, errno %d",pcVar8,(ulong)uVar3);
LAB_0052625a:
  *curlcode = CURLE_SEND_ERROR;
  return -1;
}

Assistant:

static ssize_t ossl_send(struct Curl_easy *data,
                         int sockindex,
                         const void *mem,
                         size_t len,
                         CURLcode *curlcode)
{
  /* SSL_write() is said to return 'int' while write() and send() returns
     'size_t' */
  int err;
  char error_buffer[256];
  unsigned long sslerror;
  int memlen;
  int rc;
  struct connectdata *conn = data->conn;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  struct ssl_backend_data *backend = connssl->backend;

  DEBUGASSERT(backend);

  ERR_clear_error();

  memlen = (len > (size_t)INT_MAX) ? INT_MAX : (int)len;
  set_logger(conn, data);
  rc = SSL_write(backend->handle, mem, memlen);

  if(rc <= 0) {
    err = SSL_get_error(backend->handle, rc);

    switch(err) {
    case SSL_ERROR_WANT_READ:
    case SSL_ERROR_WANT_WRITE:
      /* The operation did not complete; the same TLS/SSL I/O function
         should be called again later. This is basically an EWOULDBLOCK
         equivalent. */
      *curlcode = CURLE_AGAIN;
      return -1;
    case SSL_ERROR_SYSCALL:
      {
        int sockerr = SOCKERRNO;
        sslerror = ERR_get_error();
        if(sslerror)
          ossl_strerror(sslerror, error_buffer, sizeof(error_buffer));
        else if(sockerr)
          Curl_strerror(sockerr, error_buffer, sizeof(error_buffer));
        else {
          strncpy(error_buffer, SSL_ERROR_to_str(err), sizeof(error_buffer));
          error_buffer[sizeof(error_buffer) - 1] = '\0';
        }
        failf(data, OSSL_PACKAGE " SSL_write: %s, errno %d",
              error_buffer, sockerr);
        *curlcode = CURLE_SEND_ERROR;
        return -1;
      }
    case SSL_ERROR_SSL:
      /*  A failure in the SSL library occurred, usually a protocol error.
          The OpenSSL error queue contains more information on the error. */
      sslerror = ERR_get_error();
      if(ERR_GET_LIB(sslerror) == ERR_LIB_SSL &&
         ERR_GET_REASON(sslerror) == SSL_R_BIO_NOT_SET &&
         conn->ssl[sockindex].state == ssl_connection_complete
#ifndef CURL_DISABLE_PROXY
         && conn->proxy_ssl[sockindex].state == ssl_connection_complete
#endif
        ) {
        char ver[120];
        (void)ossl_version(ver, sizeof(ver));
        failf(data, "Error: %s does not support double SSL tunneling.", ver);
      }
      else
        failf(data, "SSL_write() error: %s",
              ossl_strerror(sslerror, error_buffer, sizeof(error_buffer)));
      *curlcode = CURLE_SEND_ERROR;
      return -1;
    }
    /* a true error */
    failf(data, OSSL_PACKAGE " SSL_write: %s, errno %d",
          SSL_ERROR_to_str(err), SOCKERRNO);
    *curlcode = CURLE_SEND_ERROR;
    return -1;
  }
  *curlcode = CURLE_OK;
  return (ssize_t)rc; /* number of bytes */
}